

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O3

Sequence * __thiscall
Sequence::subsequence(Sequence *__return_storage_ptr__,Sequence *this,int begin,int end)

{
  value_type vVar1;
  _Map_pointer ppiVar2;
  _Elt_pointer piVar3;
  ulong uVar4;
  reference pvVar5;
  value_type *pvVar6;
  ulong uVar7;
  long lVar8;
  size_type __n;
  
  Sequence(__return_storage_ptr__,end - begin);
  lVar8 = (long)begin * 4;
  __n = 0;
  do {
    ppiVar2 = (__return_storage_ptr__->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if ((long)(int)((int)((ulong)((long)(__return_storage_ptr__->m_bits).
                                        super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                        super__Deque_impl_data._M_start._M_last -
                                 (long)(__return_storage_ptr__->m_bits).
                                       super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                       super__Deque_impl_data._M_start._M_cur) >> 2) +
                    (int)((ulong)((long)(__return_storage_ptr__->m_bits).
                                        super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                        super__Deque_impl_data._M_finish._M_cur -
                                 (long)(__return_storage_ptr__->m_bits).
                                       super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                       super__Deque_impl_data._M_finish._M_first) >> 2) +
                   ((((uint)((int)ppiVar2 -
                            *(int *)&(__return_storage_ptr__->m_bits).
                                     super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                     super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (uint)(ppiVar2 == (_Map_pointer)0x0)) * 0x80) <= (long)__n) {
      return __return_storage_ptr__;
    }
    piVar3 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    uVar4 = ((long)piVar3 -
             (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 2) + __n + (long)begin;
    if ((long)uVar4 < 0) {
      uVar7 = (long)uVar4 >> 7;
LAB_0010762d:
      pvVar6 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar7] + uVar4 + uVar7 * -0x80;
    }
    else {
      if (0x7f < uVar4) {
        uVar7 = uVar4 >> 7;
        goto LAB_0010762d;
      }
      pvVar6 = (value_type *)((long)piVar3 + lVar8);
    }
    vVar1 = *pvVar6;
    pvVar5 = std::deque<int,_std::allocator<int>_>::at(&__return_storage_ptr__->m_bits,__n);
    *pvVar5 = vVar1;
    __n = __n + 1;
    lVar8 = lVar8 + 4;
  } while( true );
}

Assistant:

Sequence Sequence::subsequence(int begin, int end) {
    Sequence seq(end - begin);
    for (auto i = 0; i < seq.size(); ++i) {
        seq[i] = m_bits[begin + i];
    }
    return seq;
}